

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compound_type.c
# Opt level: O2

int get_interinter_compound_mask_rate(ModeCosts *mode_costs,MB_MODE_INFO *mbmi)

{
  int iVar1;
  
  iVar1 = 0x200;
  if ((mbmi->interinter_comp).type == '\x02') {
    if (av1_wedge_params_lookup[mbmi->bsize].wedge_types < 1) {
      return 0;
    }
    iVar1 = mode_costs->wedge_idx_cost[mbmi->bsize][(mbmi->interinter_comp).wedge_index] + 0x200;
  }
  return iVar1;
}

Assistant:

static inline int get_interinter_compound_mask_rate(
    const ModeCosts *const mode_costs, const MB_MODE_INFO *const mbmi) {
  const COMPOUND_TYPE compound_type = mbmi->interinter_comp.type;
  // This function will be called only for COMPOUND_WEDGE and COMPOUND_DIFFWTD
  if (compound_type == COMPOUND_WEDGE) {
    return av1_is_wedge_used(mbmi->bsize)
               ? av1_cost_literal(1) +
                     mode_costs
                         ->wedge_idx_cost[mbmi->bsize]
                                         [mbmi->interinter_comp.wedge_index]
               : 0;
  } else {
    assert(compound_type == COMPOUND_DIFFWTD);
    return av1_cost_literal(1);
  }
}